

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

void __thiscall helics::apps::Clone::Clone(Clone *this,string_view appName,string *configString)

{
  undefined8 *in_RDI;
  string *in_stack_00000158;
  App *in_stack_00000160;
  undefined1 in_stack_00000168 [16];
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffff50;
  Clone *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Clone *in_stack_ffffffffffffffc0;
  
  App::App(in_stack_00000160,(string_view)in_stack_00000168,in_stack_00000158);
  *in_RDI = &PTR__Clone_00a47690;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)((long)in_RDI + 0xa1) = 0;
  *(undefined1 *)((long)in_RDI + 0xa2) = 0;
  in_RDI[0x15] = 0;
  std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>::
  unique_ptr<std::default_delete<helics::CloningFilter>,void>(in_stack_ffffffffffffff50);
  CLI::std::
  vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>::
  vector((vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
          *)0x41e58b);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::deque
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)0x41e5a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x41e5b8);
  this_00 = (Clone *)(in_RDI + 0x27);
  std::unique_ptr<helics::Endpoint,std::default_delete<helics::Endpoint>>::
  unique_ptr<std::default_delete<helics::Endpoint>,void>
            ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)this_00);
  std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            *)0x41e5e4);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x2b);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x41e5fa);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x41e610);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x41e626);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x41e63c);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x41e67e);
  processArgs(in_stack_ffffffffffffffc0);
  initialSetup(this_00);
  return;
}

Assistant:

Clone::Clone(std::string_view appName, const std::string& configString): App(appName, configString)
{
    processArgs();
    initialSetup();
}